

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jobs.cpp
# Opt level: O0

ParallelThreadData * __thiscall
JsUtil::BackgroundJobProcessor::GetThreadDataFromCurrentJob(BackgroundJobProcessor *this,Job *job)

{
  code *pcVar1;
  anon_class_16_2_6eb44339 callback;
  bool bVar2;
  undefined4 *puVar3;
  ParallelThreadData *local_20;
  ParallelThreadData *currentThreadData;
  Job *job_local;
  BackgroundJobProcessor *this_local;
  
  currentThreadData = (ParallelThreadData *)job;
  job_local = (Job *)this;
  bVar2 = CCLock::IsLocked(&(this->criticalSection).super_CCLock);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x35d,"(criticalSection.IsLocked())","criticalSection.IsLocked()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_20 = (ParallelThreadData *)0x0;
  callback.currentThreadData = &local_20;
  callback.job = (Job **)&currentThreadData;
  IterateBackgroundThreads<JsUtil::BackgroundJobProcessor::GetThreadDataFromCurrentJob(JsUtil::Job*)::__0>
            (this,callback);
  return local_20;
}

Assistant:

ParallelThreadData * BackgroundJobProcessor::GetThreadDataFromCurrentJob(Job* job)
    {
        Assert(criticalSection.IsLocked());
        ParallelThreadData *currentThreadData = nullptr;
        this->IterateBackgroundThreads([&](ParallelThreadData* threadData)
        {
            if (!threadData->currentJob)
            {
                return false;
            }
            if (threadData->currentJob != job)
            {
                return false;
            }
            currentThreadData = threadData;
            return true;
        }
        );
        return currentThreadData;
    }